

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3TableAffinity(Vdbe *v,Table *pTab,int iReg)

{
  sqlite3 *db_00;
  int iVar1;
  bool bVar2;
  sqlite3 *db;
  char *zColAff;
  int i;
  int iReg_local;
  Table *pTab_local;
  Vdbe *v_local;
  
  db = (sqlite3 *)pTab->zColAff;
  if (db == (sqlite3 *)0x0) {
    db_00 = sqlite3VdbeDb(v);
    db = (sqlite3 *)sqlite3DbMallocRaw((sqlite3 *)0x0,(long)(pTab->nCol + 1));
    if (db == (sqlite3 *)0x0) {
      sqlite3OomFault(db_00);
      return;
    }
    for (zColAff._0_4_ = 0; (int)zColAff < pTab->nCol; zColAff._0_4_ = (int)zColAff + 1) {
      *(char *)((long)db->aLimit + (long)(int)zColAff + -0x70) = pTab->aCol[(int)zColAff].affinity;
    }
    do {
      iVar1 = (int)zColAff + -1;
      *(undefined1 *)((long)db->aLimit + (long)(int)zColAff + -0x70) = 0;
      bVar2 = false;
      if (-1 < iVar1) {
        bVar2 = *(char *)((long)db->aLimit + (long)iVar1 + -0x70) == 'A';
      }
      zColAff._0_4_ = iVar1;
    } while (bVar2);
    pTab->zColAff = (char *)db;
  }
  iVar1 = sqlite3Strlen30((char *)db);
  if (iVar1 != 0) {
    if (iReg == 0) {
      sqlite3VdbeChangeP4(v,-1,(char *)db,iVar1);
    }
    else {
      sqlite3VdbeAddOp4(v,0x62,iReg,iVar1,0,(char *)db,iVar1);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableAffinity(Vdbe *v, Table *pTab, int iReg){
  int i;
  char *zColAff = pTab->zColAff;
  if( zColAff==0 ){
    sqlite3 *db = sqlite3VdbeDb(v);
    zColAff = (char *)sqlite3DbMallocRaw(0, pTab->nCol+1);
    if( !zColAff ){
      sqlite3OomFault(db);
      return;
    }

    for(i=0; i<pTab->nCol; i++){
      zColAff[i] = pTab->aCol[i].affinity;
    }
    do{
      zColAff[i--] = 0;
    }while( i>=0 && zColAff[i]==SQLITE_AFF_BLOB );
    pTab->zColAff = zColAff;
  }
  i = sqlite3Strlen30(zColAff);
  if( i ){
    if( iReg ){
      sqlite3VdbeAddOp4(v, OP_Affinity, iReg, i, 0, zColAff, i);
    }else{
      sqlite3VdbeChangeP4(v, -1, zColAff, i);
    }
  }
}